

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void vli_bytesToNative(uint64_t *native,uint8_t *bytes)

{
  byte *pbVar1;
  uint8_t *digit;
  uint i;
  uint8_t *bytes_local;
  uint64_t *native_local;
  
  for (digit._4_4_ = 0; digit._4_4_ < 4; digit._4_4_ = digit._4_4_ + 1) {
    pbVar1 = bytes + (3 - digit._4_4_) * 8;
    native[digit._4_4_] =
         (ulong)*pbVar1 << 0x38 | (ulong)pbVar1[1] << 0x30 | (ulong)pbVar1[2] << 0x28 |
         (ulong)pbVar1[3] << 0x20 | (ulong)pbVar1[4] << 0x18 | (ulong)pbVar1[5] << 0x10 |
         (ulong)pbVar1[6] << 8 | (ulong)pbVar1[7];
  }
  return;
}

Assistant:

static void vli_bytesToNative(uint64_t *native, const uint8_t *bytes) {
    unsigned i;
    for (i = 0; i < uECC_WORDS; ++i) {
        const uint8_t *digit = bytes + 8 * (uECC_WORDS - 1 - i);
        native[i] = ((uint64_t)digit[0] << 56) | ((uint64_t)digit[1] << 48) |
                    ((uint64_t)digit[2] << 40) | ((uint64_t)digit[3] << 32) |
                    ((uint64_t)digit[4] << 24) | ((uint64_t)digit[5] << 16) |
                    ((uint64_t)digit[6] << 8) | (uint64_t)digit[7];
    }
}